

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
::rehash(hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
         *this,uint new_hash_size)

{
  ulong uVar1;
  undefined4 uVar2;
  raw_node *prVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint32 uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 *puVar40;
  long lVar41;
  uint uVar42;
  raw_node *prVar43;
  undefined4 *puVar44;
  uint uVar45;
  raw_node *p;
  byte bVar46;
  undefined4 uVar47;
  undefined4 uVar49;
  undefined1 auVar48 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar69;
  int iVar72;
  int iVar73;
  undefined1 auVar70 [16];
  int iVar74;
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  int iVar88;
  int iVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  elemental_vector local_48;
  uint local_38;
  undefined8 local_30;
  
  bVar46 = 0;
  if ((this->m_num_valid <= new_hash_size) &&
     (uVar39 = (ulong)new_hash_size, (this->m_values).m_size != new_hash_size)) {
    local_48.m_p = (void *)0x0;
    local_48.m_size = 0;
    local_48.m_capacity = 0;
    local_38 = 0x20;
    local_30 = 0;
    if (new_hash_size != 0) {
      if (new_hash_size != 0) {
        elemental_vector::increase_capacity
                  (&local_48,new_hash_size,new_hash_size == 1,0x48,
                   vector<crnlib::hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>::raw_node>
                   ::object_mover,false);
      }
      auVar35 = _DAT_001b10b0;
      auVar34 = _DAT_001b10a0;
      auVar33 = _DAT_001b1090;
      auVar32 = _DAT_001b1080;
      auVar31 = _DAT_001b1070;
      auVar30 = _DAT_001b1060;
      auVar29 = _DAT_001b1050;
      if (new_hash_size - local_48.m_size != 0) {
        uVar1 = (ulong)(new_hash_size - local_48.m_size) * 0x48 - 0x48;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar1;
        uVar47 = SUB164(auVar70 * ZEXT816(0xe38e38e38e38e38f),8);
        uVar49 = (undefined4)(uVar1 / 0x120000000);
        auVar75._0_8_ = CONCAT44(uVar49,uVar47);
        auVar75._8_4_ = uVar47;
        auVar75._12_4_ = uVar49;
        auVar48._0_8_ = auVar75._0_8_ >> 6;
        auVar48._8_8_ = auVar75._8_8_ >> 6;
        puVar40 = (undefined1 *)((long)local_48.m_p + (ulong)local_48.m_size * 0x48 + 0x47c);
        uVar38 = 0;
        do {
          auVar67._8_4_ = (int)uVar38;
          auVar67._0_8_ = uVar38;
          auVar67._12_4_ = (int)(uVar38 >> 0x20);
          auVar70 = auVar48 ^ auVar35;
          auVar75 = (auVar67 | auVar34) ^ auVar35;
          iVar69 = auVar70._0_4_;
          iVar88 = -(uint)(iVar69 < auVar75._0_4_);
          iVar72 = auVar70._4_4_;
          auVar77._4_4_ = -(uint)(iVar72 < auVar75._4_4_);
          iVar73 = auVar70._8_4_;
          iVar92 = -(uint)(iVar73 < auVar75._8_4_);
          iVar74 = auVar70._12_4_;
          auVar77._12_4_ = -(uint)(iVar74 < auVar75._12_4_);
          auVar59._4_4_ = iVar88;
          auVar59._0_4_ = iVar88;
          auVar59._8_4_ = iVar92;
          auVar59._12_4_ = iVar92;
          auVar70 = pshuflw(in_XMM1,auVar59,0xe8);
          auVar76._4_4_ = -(uint)(auVar75._4_4_ == iVar72);
          auVar76._12_4_ = -(uint)(auVar75._12_4_ == iVar74);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar59 = pshuflw(in_XMM2,auVar76,0xe8);
          auVar77._0_4_ = auVar77._4_4_;
          auVar77._8_4_ = auVar77._12_4_;
          auVar75 = pshuflw(auVar70,auVar77,0xe8);
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          auVar50 = (auVar75 | auVar59 & auVar70) ^ auVar50;
          auVar70 = packssdw(auVar50,auVar50);
          if ((auVar70 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar40[-0x438] = 0;
          }
          auVar16._4_4_ = iVar88;
          auVar16._0_4_ = iVar88;
          auVar16._8_4_ = iVar92;
          auVar16._12_4_ = iVar92;
          auVar77 = auVar76 & auVar16 | auVar77;
          auVar70 = packssdw(auVar77,auVar77);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar6,auVar70 ^ auVar6);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._0_4_ >> 8 & 1) != 0) {
            puVar40[-0x3f0] = 0;
          }
          auVar70 = (auVar67 | auVar33) ^ auVar35;
          auVar60._0_4_ = -(uint)(iVar69 < auVar70._0_4_);
          auVar60._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar60._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar60._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar78._4_4_ = auVar60._0_4_;
          auVar78._0_4_ = auVar60._0_4_;
          auVar78._8_4_ = auVar60._8_4_;
          auVar78._12_4_ = auVar60._8_4_;
          iVar88 = -(uint)(auVar70._4_4_ == iVar72);
          iVar92 = -(uint)(auVar70._12_4_ == iVar74);
          auVar17._4_4_ = iVar88;
          auVar17._0_4_ = iVar88;
          auVar17._8_4_ = iVar92;
          auVar17._12_4_ = iVar92;
          auVar89._4_4_ = auVar60._4_4_;
          auVar89._0_4_ = auVar60._4_4_;
          auVar89._8_4_ = auVar60._12_4_;
          auVar89._12_4_ = auVar60._12_4_;
          auVar70 = auVar17 & auVar78 | auVar89;
          auVar70 = packssdw(auVar70,auVar70);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar7,auVar70 ^ auVar7);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._0_4_ >> 0x10 & 1) != 0) {
            puVar40[-0x3a8] = 0;
          }
          auVar70 = pshufhw(auVar70,auVar78,0x84);
          auVar18._4_4_ = iVar88;
          auVar18._0_4_ = iVar88;
          auVar18._8_4_ = iVar92;
          auVar18._12_4_ = iVar92;
          auVar50 = pshufhw(auVar60,auVar18,0x84);
          auVar75 = pshufhw(auVar70,auVar89,0x84);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar75 | auVar50 & auVar70) ^ auVar51;
          auVar70 = packssdw(auVar51,auVar51);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._0_4_ >> 0x18 & 1) != 0) {
            puVar40[-0x360] = 0;
          }
          auVar70 = (auVar67 | auVar32) ^ auVar35;
          auVar61._0_4_ = -(uint)(iVar69 < auVar70._0_4_);
          auVar61._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar61._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar61._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar19._4_4_ = auVar61._0_4_;
          auVar19._0_4_ = auVar61._0_4_;
          auVar19._8_4_ = auVar61._8_4_;
          auVar19._12_4_ = auVar61._8_4_;
          auVar50 = pshuflw(auVar89,auVar19,0xe8);
          auVar52._0_4_ = -(uint)(auVar70._0_4_ == iVar69);
          auVar52._4_4_ = -(uint)(auVar70._4_4_ == iVar72);
          auVar52._8_4_ = -(uint)(auVar70._8_4_ == iVar73);
          auVar52._12_4_ = -(uint)(auVar70._12_4_ == iVar74);
          auVar79._4_4_ = auVar52._4_4_;
          auVar79._0_4_ = auVar52._4_4_;
          auVar79._8_4_ = auVar52._12_4_;
          auVar79._12_4_ = auVar52._12_4_;
          auVar70 = pshuflw(auVar52,auVar79,0xe8);
          auVar80._4_4_ = auVar61._4_4_;
          auVar80._0_4_ = auVar61._4_4_;
          auVar80._8_4_ = auVar61._12_4_;
          auVar80._12_4_ = auVar61._12_4_;
          auVar75 = pshuflw(auVar61,auVar80,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 & auVar50,(auVar75 | auVar70 & auVar50) ^ auVar8);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar40[-0x318] = 0;
          }
          auVar20._4_4_ = auVar61._0_4_;
          auVar20._0_4_ = auVar61._0_4_;
          auVar20._8_4_ = auVar61._8_4_;
          auVar20._12_4_ = auVar61._8_4_;
          auVar80 = auVar79 & auVar20 | auVar80;
          auVar75 = packssdw(auVar80,auVar80);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70,auVar75 ^ auVar9);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._4_2_ >> 8 & 1) != 0) {
            puVar40[-0x2d0] = 0;
          }
          auVar70 = (auVar67 | auVar31) ^ auVar35;
          auVar62._0_4_ = -(uint)(iVar69 < auVar70._0_4_);
          auVar62._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar62._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar62._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar81._4_4_ = auVar62._0_4_;
          auVar81._0_4_ = auVar62._0_4_;
          auVar81._8_4_ = auVar62._8_4_;
          auVar81._12_4_ = auVar62._8_4_;
          iVar88 = -(uint)(auVar70._4_4_ == iVar72);
          iVar92 = -(uint)(auVar70._12_4_ == iVar74);
          auVar21._4_4_ = iVar88;
          auVar21._0_4_ = iVar88;
          auVar21._8_4_ = iVar92;
          auVar21._12_4_ = iVar92;
          auVar90._4_4_ = auVar62._4_4_;
          auVar90._0_4_ = auVar62._4_4_;
          auVar90._8_4_ = auVar62._12_4_;
          auVar90._12_4_ = auVar62._12_4_;
          auVar70 = auVar21 & auVar81 | auVar90;
          auVar70 = packssdw(auVar70,auVar70);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar10,auVar70 ^ auVar10);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar40[-0x288] = 0;
          }
          auVar70 = pshufhw(auVar70,auVar81,0x84);
          auVar22._4_4_ = iVar88;
          auVar22._0_4_ = iVar88;
          auVar22._8_4_ = iVar92;
          auVar22._12_4_ = iVar92;
          auVar50 = pshufhw(auVar62,auVar22,0x84);
          auVar75 = pshufhw(auVar70,auVar90,0x84);
          auVar53._8_4_ = 0xffffffff;
          auVar53._0_8_ = 0xffffffffffffffff;
          auVar53._12_4_ = 0xffffffff;
          auVar53 = (auVar75 | auVar50 & auVar70) ^ auVar53;
          auVar70 = packssdw(auVar53,auVar53);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._6_2_ >> 8 & 1) != 0) {
            puVar40[-0x240] = 0;
          }
          auVar70 = (auVar67 | auVar30) ^ auVar35;
          auVar63._0_4_ = -(uint)(iVar69 < auVar70._0_4_);
          auVar63._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar63._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar63._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar23._4_4_ = auVar63._0_4_;
          auVar23._0_4_ = auVar63._0_4_;
          auVar23._8_4_ = auVar63._8_4_;
          auVar23._12_4_ = auVar63._8_4_;
          auVar50 = pshuflw(auVar90,auVar23,0xe8);
          auVar54._0_4_ = -(uint)(auVar70._0_4_ == iVar69);
          auVar54._4_4_ = -(uint)(auVar70._4_4_ == iVar72);
          auVar54._8_4_ = -(uint)(auVar70._8_4_ == iVar73);
          auVar54._12_4_ = -(uint)(auVar70._12_4_ == iVar74);
          auVar82._4_4_ = auVar54._4_4_;
          auVar82._0_4_ = auVar54._4_4_;
          auVar82._8_4_ = auVar54._12_4_;
          auVar82._12_4_ = auVar54._12_4_;
          auVar70 = pshuflw(auVar54,auVar82,0xe8);
          auVar83._4_4_ = auVar63._4_4_;
          auVar83._0_4_ = auVar63._4_4_;
          auVar83._8_4_ = auVar63._12_4_;
          auVar83._12_4_ = auVar63._12_4_;
          auVar75 = pshuflw(auVar63,auVar83,0xe8);
          auVar64._8_4_ = 0xffffffff;
          auVar64._0_8_ = 0xffffffffffffffff;
          auVar64._12_4_ = 0xffffffff;
          auVar64 = (auVar75 | auVar70 & auVar50) ^ auVar64;
          auVar75 = packssdw(auVar64,auVar64);
          auVar70 = packsswb(auVar70 & auVar50,auVar75);
          if ((auVar70 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar40[-0x1f8] = 0;
          }
          auVar24._4_4_ = auVar63._0_4_;
          auVar24._0_4_ = auVar63._0_4_;
          auVar24._8_4_ = auVar63._8_4_;
          auVar24._12_4_ = auVar63._8_4_;
          auVar83 = auVar82 & auVar24 | auVar83;
          auVar75 = packssdw(auVar83,auVar83);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75 ^ auVar11,auVar75 ^ auVar11);
          auVar70 = packsswb(auVar70,auVar75);
          if ((auVar70._8_2_ >> 8 & 1) != 0) {
            puVar40[-0x1b0] = 0;
          }
          auVar70 = (auVar67 | auVar29) ^ auVar35;
          auVar65._0_4_ = -(uint)(iVar69 < auVar70._0_4_);
          auVar65._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar65._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar65._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar84._4_4_ = auVar65._0_4_;
          auVar84._0_4_ = auVar65._0_4_;
          auVar84._8_4_ = auVar65._8_4_;
          auVar84._12_4_ = auVar65._8_4_;
          iVar88 = -(uint)(auVar70._4_4_ == iVar72);
          iVar92 = -(uint)(auVar70._12_4_ == iVar74);
          auVar25._4_4_ = iVar88;
          auVar25._0_4_ = iVar88;
          auVar25._8_4_ = iVar92;
          auVar25._12_4_ = iVar92;
          auVar91._4_4_ = auVar65._4_4_;
          auVar91._0_4_ = auVar65._4_4_;
          auVar91._8_4_ = auVar65._12_4_;
          auVar91._12_4_ = auVar65._12_4_;
          auVar70 = auVar25 & auVar84 | auVar91;
          auVar70 = packssdw(auVar70,auVar70);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar12,auVar70 ^ auVar12);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar40[-0x168] = 0;
          }
          auVar70 = pshufhw(auVar70,auVar84,0x84);
          auVar26._4_4_ = iVar88;
          auVar26._0_4_ = iVar88;
          auVar26._8_4_ = iVar92;
          auVar26._12_4_ = iVar92;
          auVar50 = pshufhw(auVar65,auVar26,0x84);
          auVar75 = pshufhw(auVar70,auVar91,0x84);
          auVar55._8_4_ = 0xffffffff;
          auVar55._0_8_ = 0xffffffffffffffff;
          auVar55._12_4_ = 0xffffffff;
          auVar55 = (auVar75 | auVar50 & auVar70) ^ auVar55;
          auVar70 = packssdw(auVar55,auVar55);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._10_2_ >> 8 & 1) != 0) {
            puVar40[-0x120] = 0;
          }
          auVar70 = (auVar67 | _DAT_001b1040) ^ auVar35;
          auVar66._0_4_ = -(uint)(iVar69 < auVar70._0_4_);
          auVar66._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar66._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar66._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar27._4_4_ = auVar66._0_4_;
          auVar27._0_4_ = auVar66._0_4_;
          auVar27._8_4_ = auVar66._8_4_;
          auVar27._12_4_ = auVar66._8_4_;
          auVar50 = pshuflw(auVar91,auVar27,0xe8);
          auVar56._0_4_ = -(uint)(auVar70._0_4_ == iVar69);
          auVar56._4_4_ = -(uint)(auVar70._4_4_ == iVar72);
          auVar56._8_4_ = -(uint)(auVar70._8_4_ == iVar73);
          auVar56._12_4_ = -(uint)(auVar70._12_4_ == iVar74);
          auVar85._4_4_ = auVar56._4_4_;
          auVar85._0_4_ = auVar56._4_4_;
          auVar85._8_4_ = auVar56._12_4_;
          auVar85._12_4_ = auVar56._12_4_;
          auVar70 = pshuflw(auVar56,auVar85,0xe8);
          auVar86._4_4_ = auVar66._4_4_;
          auVar86._0_4_ = auVar66._4_4_;
          auVar86._8_4_ = auVar66._12_4_;
          auVar86._12_4_ = auVar66._12_4_;
          auVar75 = pshuflw(auVar66,auVar86,0xe8);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 & auVar50,(auVar75 | auVar70 & auVar50) ^ auVar13);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar40[-0xd8] = 0;
          }
          auVar28._4_4_ = auVar66._0_4_;
          auVar28._0_4_ = auVar66._0_4_;
          auVar28._8_4_ = auVar66._8_4_;
          auVar28._12_4_ = auVar66._8_4_;
          auVar86 = auVar85 & auVar28 | auVar86;
          auVar75 = packssdw(auVar86,auVar86);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70,auVar75 ^ auVar14);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70._12_2_ >> 8 & 1) != 0) {
            puVar40[-0x90] = 0;
          }
          auVar70 = (auVar67 | _DAT_001b1030) ^ auVar35;
          auVar57._0_4_ = -(uint)(iVar69 < auVar70._0_4_);
          auVar57._4_4_ = -(uint)(iVar72 < auVar70._4_4_);
          auVar57._8_4_ = -(uint)(iVar73 < auVar70._8_4_);
          auVar57._12_4_ = -(uint)(iVar74 < auVar70._12_4_);
          auVar87._4_4_ = auVar57._0_4_;
          auVar87._0_4_ = auVar57._0_4_;
          auVar87._8_4_ = auVar57._8_4_;
          auVar87._12_4_ = auVar57._8_4_;
          auVar68._4_4_ = -(uint)(auVar70._4_4_ == iVar72);
          auVar68._12_4_ = -(uint)(auVar70._12_4_ == iVar74);
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar71._4_4_ = auVar57._4_4_;
          auVar71._0_4_ = auVar57._4_4_;
          auVar71._8_4_ = auVar57._12_4_;
          auVar71._12_4_ = auVar57._12_4_;
          auVar75 = auVar68 & auVar87 | auVar71;
          auVar70 = packssdw(auVar57,auVar75);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar15,auVar70 ^ auVar15);
          auVar70 = packsswb(auVar70,auVar70);
          if ((auVar70 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar40[-0x48] = 0;
          }
          auVar70 = pshufhw(auVar70,auVar87,0x84);
          auVar75 = pshufhw(auVar75,auVar68,0x84);
          in_XMM2 = auVar75 & auVar70;
          auVar70 = pshufhw(auVar70,auVar71,0x84);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar70 | in_XMM2) ^ auVar58;
          auVar70 = packssdw(auVar58,auVar58);
          in_XMM1 = packsswb(auVar70,auVar70);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *puVar40 = 0;
          }
          uVar38 = uVar38 + 0x10;
          puVar40 = puVar40 + 0x480;
        } while ((uVar1 / 0x48 + 0x10 & 0xfffffffffffffff0) != uVar38);
      }
      local_48.m_size = new_hash_size;
    }
    local_38 = 0x20;
    if (1 < new_hash_size) {
      do {
        local_38 = local_38 - 1;
        uVar37 = (uint)uVar39;
        uVar39 = uVar39 >> 1;
      } while (3 < uVar37);
    }
    local_30._4_4_ = 0xffffffff;
    uVar39 = (ulong)(this->m_values).m_size;
    if (uVar39 != 0) {
      p = (this->m_values).m_p;
      prVar3 = p + uVar39;
      do {
        if (p->m_bits[0x44] != '\0') {
          uVar36 = fast_hash(p,0x40);
          uVar37 = uVar36 * -0x61c88647 >> ((byte)local_38 & 0x1f);
          puVar44 = (undefined4 *)((long)local_48.m_p + (ulong)uVar37 * 0x48);
          if (*(char *)(puVar44 + 0x11) != '\0') {
            uVar45 = uVar37;
            do {
              uVar42 = uVar45 - 1;
              if (uVar45 == 0) {
                uVar42 = local_48.m_size - 1;
              }
              if (uVar42 == uVar37) goto LAB_00194b2f;
              puVar44 = puVar44 + -0x12;
              if (uVar45 == 0) {
                puVar44 = (undefined4 *)((long)local_48.m_p + (ulong)(local_48.m_size - 1) * 0x48);
              }
              uVar45 = uVar42;
            } while (*(char *)(puVar44 + 0x11) != '\0');
          }
          prVar43 = p;
          for (lVar41 = 0x12; lVar41 != 0; lVar41 = lVar41 + -1) {
            *puVar44 = *(undefined4 *)prVar43->m_bits;
            prVar43 = (raw_node *)((long)prVar43 + ((ulong)bVar46 * -2 + 1) * 4);
            puVar44 = puVar44 + (ulong)bVar46 * -2 + 1;
          }
          p->m_bits[0x44] = '\0';
          local_30._0_4_ = (uint)local_30 + 1;
LAB_00194b2f:
          if ((uint)local_30 == this->m_num_valid) break;
        }
        p = p + 1;
      } while (p != prVar3);
    }
    local_30 = CONCAT44(new_hash_size + 1 >> 1,(uint)local_30);
    prVar3 = (this->m_values).m_p;
    if (prVar3 != (raw_node *)0x0) {
      crnlib_free(prVar3);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    prVar3 = (this->m_values).m_p;
    (this->m_values).m_p = (raw_node *)local_48.m_p;
    uVar2 = (this->m_values).m_size;
    uVar5 = (this->m_values).m_capacity;
    (this->m_values).m_size = local_48.m_size;
    (this->m_values).m_capacity = local_48.m_capacity;
    local_48.m_size = uVar2;
    local_48.m_capacity = uVar5;
    local_48.m_p = prVar3;
    this->m_hash_shift = local_38;
    local_38 = 0x20;
    uVar4._0_4_ = this->m_num_valid;
    uVar4._4_4_ = this->m_grow_threshold;
    this->m_num_valid = (uint)local_30;
    this->m_grow_threshold = local_30._4_4_;
    local_30 = uVar4;
    if (uVar2 != 0) {
      if (prVar3 != (raw_node *)0x0) {
        crnlib_free(prVar3);
        local_48.m_p = (void *)0x0;
        local_48.m_size = 0;
        local_48.m_capacity = 0;
      }
      local_30 = 0;
    }
    local_38 = 0x20;
    if (local_48.m_p != (void *)0x0) {
      crnlib_free(local_48.m_p);
    }
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size) {
    CRNLIB_ASSERT(new_hash_size >= m_num_valid);
    CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

    if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
      return;

    hash_map new_map;
    new_map.m_values.resize(new_hash_size);
    new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
    CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
    new_map.m_grow_threshold = UINT_MAX;

    node* pNode = reinterpret_cast<node*>(m_values.begin());
    node* pNode_end = pNode + m_values.size();

    while (pNode != pNode_end) {
      if (pNode->state) {
        new_map.move_into(pNode);

        if (new_map.m_num_valid == m_num_valid)
          break;
      }

      pNode++;
    }

    new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

    m_values.clear_no_destruction();
    m_hash_shift = 32;

    swap(new_map);
  }